

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

void tag_nbviterbi(mdl_t *mdl,seq_t *seq,uint32_t N,uint32_t **out,double *sc,double **psc)

{
  long lVar1;
  double *pdVar2;
  uint64_t *puVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  void *pvVar9;
  void *__ptr;
  ulong uVar10;
  uint uVar11;
  mdl_t *pmVar12;
  void *pvVar13;
  ulong uVar14;
  uint64_t **ppuVar15;
  ulong uVar16;
  undefined1 *puVar17;
  uint32_t uVar18;
  seq_t *psVar19;
  int iVar20;
  ulong uVar21;
  mdl_t *pmVar22;
  ulong uVar23;
  mdl_t *pmVar24;
  size_t size;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  int iVar29;
  undefined1 auStack_e8 [8];
  uint32_t **local_e0;
  ulong local_d8;
  undefined1 *local_d0;
  void *local_c8;
  ulong local_c0;
  ulong local_b8;
  double *local_b0;
  long local_a8;
  long local_a0;
  double **local_98;
  void *local_90;
  ulong local_88;
  void *local_80;
  seq_t *local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  mdl_t *local_58;
  seq_t *local_50;
  mdl_t *local_48;
  mdl_t *local_40;
  double *local_38;
  long lVar27;
  
  puVar17 = auStack_e8;
  uVar23 = (ulong)N;
  uVar11 = mdl->nlbl;
  pmVar24 = (mdl_t *)(ulong)uVar11;
  uVar4 = seq->len;
  local_e0 = out;
  local_b0 = sc;
  local_98 = psc;
  local_58 = pmVar24;
  local_40 = mdl;
  local_38 = xvm_new((ulong)(uVar11 * uVar11 * uVar4));
  local_68 = (ulong)uVar4;
  local_48 = pmVar24;
  local_60 = xmalloc((long)pmVar24 * uVar23 * (ulong)uVar4 * 4);
  size = (long)pmVar24 * uVar23 * 8;
  pvVar9 = xmalloc(size);
  __ptr = xmalloc(size);
  local_50 = seq;
  if (local_40->type == 1) {
    tag_memmsc(local_40,seq,local_38);
  }
  else {
    if (local_40->opt->lblpost != true) {
      tag_expsc(local_40,seq,local_38);
      iVar20 = 0;
      bVar6 = true;
      goto LAB_00107139;
    }
    tag_postsc(local_40,seq,local_38);
  }
  iVar20 = 1;
  bVar6 = false;
LAB_00107139:
  if (local_40->opt->force == true) {
    tag_forced((mdl_t *)(ulong)local_40->nlbl,local_50,local_38,iVar20);
  }
  pmVar24 = local_48;
  pmVar22 = (mdl_t *)(ulong)((int)local_58 * N);
  if (local_48 != (mdl_t *)0x0) {
    uVar11 = 0;
    pmVar12 = (mdl_t *)0x0;
    do {
      *(double *)((long)pvVar9 + (ulong)uVar11 * 8) = local_38[(long)pmVar12];
      if (1 < N) {
        uVar18 = 1;
        do {
          *(undefined8 *)((long)pvVar9 + (ulong)(uVar11 + uVar18) * 8) = 0xffefffffffffffff;
          uVar18 = uVar18 + 1;
        } while (N != uVar18);
      }
      pmVar12 = (mdl_t *)((long)&pmVar12->opt + 1);
      uVar11 = uVar11 + N + (N == 0);
    } while (pmVar12 != local_48);
  }
  auVar8 = _DAT_001120d0;
  auVar7 = _DAT_001120c0;
  local_58 = pmVar22;
  if (1 < (uint)local_68) {
    local_b8 = uVar23 + 1 & 0xfffffffffffffffe;
    lVar1 = uVar23 - 1;
    auVar25._8_4_ = (int)lVar1;
    auVar25._0_8_ = lVar1;
    auVar25._12_4_ = (int)((ulong)lVar1 >> 0x20);
    local_78 = (seq_t *)(local_38 + (long)local_48 * (long)local_48);
    local_a8 = (long)local_48 * (long)local_48 * 8;
    lVar1 = (long)local_48 * 8;
    local_a0 = (long)pmVar22 * 4;
    local_80 = (void *)((long)local_60 + (long)pmVar22 * 4);
    local_70 = 1;
    local_c0 = (long)pmVar22 * 8 + 0xfU & 0xfffffffffffffff0;
    auVar25 = auVar25 ^ _DAT_001120d0;
    puVar17 = auStack_e8;
    do {
      if ((int)pmVar22 != 0) {
        uVar10 = 0;
        do {
          *(undefined8 *)((long)__ptr + uVar10 * 8) = *(undefined8 *)((long)pvVar9 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (pmVar22 != (mdl_t *)uVar10);
      }
      if ((int)local_48 != 0) {
        local_90 = (void *)((long)local_60 + local_70 * (long)pmVar22 * 4);
        uVar10 = 0;
        local_40 = (mdl_t *)0x0;
        psVar19 = local_78;
        do {
          uVar14 = local_c0;
          local_d0 = puVar17;
          local_d8 = uVar10;
          local_c8 = (void *)((long)local_80 + uVar10 * 4);
          pmVar12 = (mdl_t *)0x0;
          local_50 = psVar19;
          iVar20 = 0;
          do {
            ppuVar15 = (uint64_t **)((long)&local_50->len + lVar1 * (long)pmVar12);
            while (pmVar12 = (mdl_t *)((long)&pmVar12->opt + 1), N == 0) {
              ppuVar15 = ppuVar15 + (long)pmVar24;
              pvVar13 = local_90;
              if (pmVar12 == pmVar24) goto LAB_001073f1;
            }
            puVar3 = *ppuVar15;
            uVar18 = 0;
            do {
              dVar28 = *(double *)((long)__ptr + (ulong)(iVar20 + uVar18) * 8);
              if (bVar6) {
                dVar28 = dVar28 + (double)puVar3;
              }
              else {
                dVar28 = dVar28 * (double)puVar3;
              }
              *(double *)(puVar17 + ((ulong)(iVar20 + uVar18) * 8 - uVar14)) = dVar28;
              uVar18 = uVar18 + 1;
            } while (N != uVar18);
            iVar20 = iVar20 + N;
          } while (pmVar12 != pmVar24);
          local_88 = (ulong)((int)local_40 * N);
          pvVar13 = (void *)((long)local_90 + local_88 * 4);
          if (N == 0) {
LAB_001073f1:
            local_88 = 0;
          }
          else {
            uVar10 = 0;
            auVar26 = auVar7;
            do {
              bVar5 = auVar25._0_4_ < SUB164(auVar26 ^ auVar8,0);
              iVar20 = auVar25._4_4_;
              iVar29 = SUB164(auVar26 ^ auVar8,4);
              if ((bool)(~(iVar20 < iVar29 || iVar29 == iVar20 && bVar5) & 1)) {
                *(int *)((long)local_c8 + uVar10 * 4) = (int)uVar10;
              }
              if (iVar20 >= iVar29 && (iVar29 != iVar20 || !bVar5)) {
                *(int *)((long)local_c8 + uVar10 * 4 + 4) = (int)uVar10 + 1;
              }
              uVar10 = uVar10 + 2;
              lVar27 = auVar26._8_8_;
              auVar26._0_8_ = auVar26._0_8_ + 2;
              auVar26._8_8_ = lVar27 + 2;
            } while (local_b8 != uVar10);
          }
          uVar10 = uVar23;
          if (N < (uint)pmVar22) {
            do {
              if (N < 2) {
                uVar16 = 0;
              }
              else {
                uVar11 = 0;
                uVar21 = 1;
                do {
                  uVar16 = uVar21 & 0xffffffff;
                  if (*(double *)
                       (puVar17 + ((ulong)*(uint *)((long)pvVar13 + (ulong)uVar11 * 4) * 8 - uVar14)
                       ) < *(double *)
                            (puVar17 + ((ulong)*(uint *)((long)pvVar13 + uVar21 * 4) * 8 - uVar14))
                      || *(double *)
                          (puVar17 +
                          ((ulong)*(uint *)((long)pvVar13 + (ulong)uVar11 * 4) * 8 - uVar14)) ==
                         *(double *)
                          (puVar17 + ((ulong)*(uint *)((long)pvVar13 + uVar21 * 4) * 8 - uVar14))) {
                    uVar16 = (ulong)uVar11;
                  }
                  uVar21 = uVar21 + 1;
                  uVar11 = (uint)uVar16;
                  pmVar22 = local_58;
                } while (uVar23 != uVar21);
              }
              if (*(double *)(puVar17 + ((ulong)*(uint *)((long)pvVar13 + uVar16 * 4) * 8 - uVar14))
                  <= *(double *)(puVar17 + (uVar10 * 8 - uVar14)) &&
                  *(double *)(puVar17 + (uVar10 * 8 - uVar14)) !=
                  *(double *)(puVar17 + ((ulong)*(uint *)((long)pvVar13 + uVar16 * 4) * 8 - uVar14))
                 ) {
                *(int *)((long)pvVar13 + uVar16 * 4) = (int)uVar10;
              }
              uVar10 = uVar10 + 1;
            } while ((mdl_t *)uVar10 != pmVar22);
          }
          if (N != 0) {
            uVar10 = 0;
            do {
              *(undefined8 *)((long)pvVar9 + (ulong)(uint)((int)local_88 + (int)uVar10) * 8) =
                   *(undefined8 *)
                    (puVar17 + ((ulong)*(uint *)((long)pvVar13 + uVar10 * 4) * 8 - uVar14));
              uVar10 = uVar10 + 1;
            } while (uVar23 != uVar10);
          }
          local_40 = (mdl_t *)((long)&local_40->opt + 1);
          psVar19 = (seq_t *)&local_50->raw;
          uVar10 = (ulong)((int)local_d8 + N);
          puVar17 = local_d0;
        } while (local_40 != local_48);
      }
      local_70 = local_70 + 1;
      local_78 = (seq_t *)((long)&local_78->len + local_a8);
      local_80 = (void *)((long)local_80 + local_a0);
    } while (local_70 != local_68);
  }
  if (N == 0) {
LAB_00107605:
    *(undefined8 *)(puVar17 + -8) = 0x10760d;
    free(__ptr);
    *(undefined8 *)(puVar17 + -8) = 0x107615;
    free(pvVar9);
    pvVar9 = local_60;
    *(undefined8 *)(puVar17 + -8) = 0x10761e;
    free(pvVar9);
    xvm_free(local_38);
    return;
  }
  uVar10 = 0;
LAB_001074fe:
  uVar14 = 0;
  if (1 < (uint)pmVar22) {
    uVar21 = 1;
    uVar16 = 0;
    do {
      dVar28 = *(double *)((long)pvVar9 + uVar21 * 8);
      pdVar2 = (double *)((long)pvVar9 + uVar16 * 8);
      uVar14 = uVar21 & 0xffffffff;
      if (dVar28 < *pdVar2 || dVar28 == *pdVar2) {
        uVar14 = uVar16;
      }
      uVar21 = uVar21 + 1;
      uVar16 = uVar14;
    } while (pmVar22 != (mdl_t *)uVar21);
  }
  if (local_b0 != (double *)0x0) {
    local_b0[uVar10] = *(double *)((long)pvVar9 + uVar14 * 8);
  }
  *(undefined8 *)((long)pvVar9 + uVar14 * 8) = 0xffefffffffffffff;
  uVar16 = local_68;
  do {
    iVar20 = (int)uVar16;
    if (iVar20 == 1) {
      uVar16 = 0;
      uVar21 = 0;
    }
    else {
      if (iVar20 == 0) break;
      uVar16 = (ulong)(iVar20 - 1);
      uVar21 = (ulong)*(uint *)((long)local_60 + uVar14 * 4 + uVar16 * (long)local_58 * 4) /
               (ulong)N;
    }
    local_e0[uVar16][uVar10] = (uint32_t)(uVar14 / N);
    if (local_98 != (double **)0x0) {
      local_98[uVar16][uVar10] =
           local_38[(long)local_48 * (long)local_48 * uVar16 + uVar21 * (long)local_48 + uVar14 / N]
      ;
    }
    uVar14 = (ulong)*(uint *)((long)local_60 + uVar14 * 4 + uVar16 * (long)local_58 * 4);
  } while( true );
  uVar10 = uVar10 + 1;
  pmVar22 = local_58;
  if (uVar10 == uVar23) goto LAB_00107605;
  goto LAB_001074fe;
}

Assistant:

void tag_nbviterbi(mdl_t *mdl, const seq_t *seq, uint32_t N,
                   uint32_t **out, double sc[], double **psc) {
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   *vpsi  = xvm_new(T * Y * Y);
	uint32_t *vback = xmalloc(sizeof(uint32_t) * T * Y * N);
	double   (*psi) [T][Y    ][Y] = (void *)vpsi;
	uint32_t (*back)[T][Y * N]    = (void *)vback;
	double *cur = xmalloc(sizeof(double) * Y * N);
	double *old = xmalloc(sizeof(double) * Y * N);
	// We first compute the scores for each transitions in the lattice of
	// labels.
	int op;
	if (mdl->type == 1)
		op = tag_memmsc(mdl, seq, vpsi);
	else if (mdl->opt->lblpost)
		op = tag_postsc(mdl, seq, (double *)psi);
	else
		op = tag_expsc(mdl, seq, (double *)psi);
	if (mdl->opt->force)
		tag_forced(mdl, seq, vpsi, op);
	// Here also, it's classical but we have to keep the N best paths
	// leading to each nodes of the lattice instead of only the best one.
	// This mean that code is less trivial and the current implementation is
	// not the most efficient way to do this but it works well and is good
	// enough for the moment.
	// We first build the list of all incoming arcs from all paths from all
	// N-best nodes and next select the N-best one. There is a lot of room
	// here for later optimisations if needed.
	for (uint32_t y = 0, d = 0; y < Y; y++) {
		cur[d++] = (*psi)[0][0][y];
		for (uint32_t n = 1; n < N; n++)
			cur[d++] = -DBL_MAX;
	}
	for (uint32_t t = 1; t < T; t++) {
		for (uint32_t d = 0; d < Y * N; d++)
			old[d] = cur[d];
		for (uint32_t y = 0; y < Y; y++) {
			// 1st, build the list of all incoming
			double lst[Y * N];
			for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
				for (uint32_t n = 0; n < N; n++, d++) {
					lst[d] = old[d];
					if (op)
						lst[d] *= (*psi)[t][yp][y];
					else
						lst[d] += (*psi)[t][yp][y];
				}
			}
			// 2nd, init the back with the N first
			uint32_t *bk = &(*back)[t][y * N];
			for (uint32_t n = 0; n < N; n++)
				bk[n] = n;
			// 3rd, search the N highest values
			for (uint32_t i = N; i < N * Y; i++) {
				// Search the smallest current value
				uint32_t idx = 0;
				for (uint32_t n = 1; n < N; n++)
					if (lst[bk[n]] < lst[bk[idx]])
						idx = n;
				// And replace it if needed
				if (lst[i] > lst[bk[idx]])
					bk[idx] = i;
			}
			// 4th, get the new scores
			for (uint32_t n = 0; n < N; n++)
				cur[y * N + n] = lst[bk[n]];
		}
	}
	// Retrieving the best paths is similar to classical Viterbi except that
	// we have to search for the N bet ones and there is N time more
	// possibles starts.
	for (uint32_t n = 0; n < N; n++) {
		uint32_t bst = 0;
		for (uint32_t d = 1; d < Y * N; d++)
			if (cur[d] > cur[bst])
				bst = d;
		if (sc != NULL)
			sc[n] = cur[bst];
		cur[bst] = -DBL_MAX;
		for (uint32_t t = T; t > 0; t--) {
			const uint32_t yp = (t != 1) ? (*back)[t - 1][bst] / N: 0;
			const uint32_t y  = bst / N;
			out[t - 1][n] = y;
			if (psc != NULL)
				psc[t - 1][n] = (*psi)[t - 1][yp][y];
			bst = (*back)[t - 1][bst];
		}
	}
	free(old);
	free(cur);
	free(vback);
	xvm_free(vpsi);
}